

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::FormatCountableNoun_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,int count,char *singular_form,
          char *plural_form)

{
  undefined4 in_register_00000014;
  char *local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *plural_form_local;
  char *singular_form_local;
  string *psStack_10;
  int count_local;
  
  plural_form_local = (char *)CONCAT44(in_register_00000014,count);
  singular_form_local._4_4_ = (int)this;
  local_28 = singular_form;
  psStack_10 = __return_storage_ptr__;
  internal::StreamableToString<int>(&local_68,(int *)((long)&singular_form_local + 4));
  std::operator+(&local_48,&local_68," ");
  if (singular_form_local._4_4_ == 1) {
    local_98 = plural_form_local;
  }
  else {
    local_98 = local_28;
  }
  std::operator+(__return_storage_ptr__,&local_48,local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCountableNoun(int count, const char* singular_form,
                                       const char* plural_form) {
  return internal::StreamableToString(count) + " " +
         (count == 1 ? singular_form : plural_form);
}